

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int patternCompare(u8 *zPattern,u8 *zString,compareInfo *pInfo,u32 esc)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  u8 uVar4;
  compareInfo *pInfo_00;
  bool bVar5;
  u32 uVar6;
  u32 uVar7;
  u32 uVar8;
  u32 uVar9;
  int iVar10;
  bool bVar11;
  u8 *puVar12;
  uint uVar13;
  u32 uVar14;
  byte *zString_00;
  bool bVar15;
  bool bVar16;
  u8 *local_58;
  byte *local_50;
  u32 local_48;
  u32 local_44;
  u32 local_40;
  u32 local_3c;
  compareInfo *local_38;
  
  bVar1 = pInfo->matchOne;
  uVar8 = (u32)bVar1;
  bVar2 = pInfo->matchAll;
  uVar7 = (u32)bVar2;
  bVar3 = pInfo->matchSet;
  uVar14 = (u32)bVar3;
  uVar4 = pInfo->noCase;
  local_58 = zPattern;
  local_50 = zString;
  local_48 = esc;
  local_38 = pInfo;
  uVar6 = sqlite3Utf8Read(&local_58);
  if (uVar6 != 0) {
    bVar16 = false;
    local_44 = (u32)bVar2;
    local_3c = (u32)bVar3;
    local_40 = (u32)bVar1;
    do {
      if (uVar6 == uVar7 && !bVar16) {
        uVar6 = sqlite3Utf8Read(&local_58);
        bVar16 = uVar6 == uVar8;
        if ((uVar6 == uVar7) || (uVar6 == uVar8)) {
          do {
            if ((bVar16) && (uVar7 = sqlite3Utf8Read(&local_50), uVar7 == 0)) {
              return 0;
            }
            uVar6 = sqlite3Utf8Read(&local_58);
            bVar16 = uVar6 == uVar8;
          } while ((uVar6 == local_44) || (uVar6 == uVar8));
        }
        pInfo_00 = local_38;
        if (uVar6 != 0) {
          if (uVar6 == local_48) {
            uVar6 = sqlite3Utf8Read(&local_58);
            if (uVar6 == 0) {
              return 0;
            }
          }
          else if (uVar6 == uVar14) {
            if (*local_50 == 0) {
              return 0;
            }
            puVar12 = local_58 + -1;
            zString_00 = local_50;
            do {
              iVar10 = patternCompare(puVar12,zString_00,pInfo_00,local_48);
              uVar13 = (uint)(iVar10 != 0);
              if (iVar10 != 0) {
                return uVar13;
              }
              zString_00 = zString_00 + 1;
            } while (*zString_00 != 0);
            return uVar13;
          }
          puVar12 = local_58;
          do {
            uVar7 = sqlite3Utf8Read(&local_50);
            if (uVar7 == 0) {
              return 0;
            }
            if (uVar4 == '\0') {
              uVar8 = 1;
              uVar14 = uVar7;
              do {
                uVar7 = uVar8;
                if (uVar14 == uVar6) break;
                uVar7 = sqlite3Utf8Read(&local_50);
                uVar8 = uVar7;
                uVar14 = uVar7;
              } while (uVar7 != 0);
            }
            else {
              if (uVar7 < 0x80) {
                uVar7 = (u32)""[uVar7];
              }
              if (uVar6 < 0x80) {
                uVar6 = (u32)""[uVar6];
              }
              while ((uVar7 != 0 && (uVar7 != uVar6))) {
                uVar7 = sqlite3Utf8Read(&local_50);
                if (uVar7 < 0x80) {
                  uVar7 = (u32)""[uVar7];
                }
              }
            }
            if (uVar7 == 0) {
              return 0;
            }
            iVar10 = patternCompare(puVar12,local_50,pInfo_00,local_48);
          } while (iVar10 == 0);
        }
        return 1;
      }
      if (uVar6 == uVar8 && !bVar16) {
        uVar6 = sqlite3Utf8Read(&local_50);
        bVar16 = false;
        if (uVar6 == 0) {
          return 0;
        }
      }
      else {
        if (uVar6 == uVar14) {
          uVar7 = sqlite3Utf8Read(&local_50);
          if (uVar7 == 0) {
            return 0;
          }
          uVar8 = sqlite3Utf8Read(&local_58);
          bVar15 = uVar8 == 0x5e;
          if (bVar15) {
            uVar8 = sqlite3Utf8Read(&local_58);
          }
          bVar11 = false;
          uVar14 = 0;
          if (uVar8 != 0x5d) goto LAB_00150561;
          bVar11 = uVar7 == 0x5d;
LAB_00150552:
          uVar14 = 0;
LAB_00150554:
          uVar8 = sqlite3Utf8Read(&local_58);
LAB_00150561:
          if (uVar8 == 0x2d) {
            if ((*local_58 != ']') && (uVar14 != 0 && *local_58 != '\0')) goto code_r0x001505c0;
          }
          else {
            if (uVar8 == 0x5d) {
              uVar7 = local_44;
              uVar8 = local_40;
              uVar14 = local_3c;
              if (bVar11 == bVar15) {
                return 0;
              }
              goto LAB_0015058f;
            }
            if (uVar8 == 0) {
              return 0;
            }
          }
          uVar14 = uVar8;
          if (uVar7 == uVar8) {
            bVar11 = true;
          }
          goto LAB_00150554;
        }
        bVar15 = uVar6 != local_48 || bVar16;
        bVar16 = true;
        if (bVar15) {
          uVar9 = sqlite3Utf8Read(&local_50);
          if (uVar4 != '\0') {
            if (uVar6 < 0x80) {
              uVar6 = (u32)""[uVar6];
            }
            if (uVar9 < 0x80) {
              uVar9 = (u32)""[uVar9];
            }
          }
          bVar16 = false;
          if (uVar6 != uVar9) {
            return 0;
          }
        }
      }
LAB_0015058f:
      uVar6 = sqlite3Utf8Read(&local_58);
    } while (uVar6 != 0);
  }
  return (uint)(*local_50 == 0);
code_r0x001505c0:
  uVar8 = sqlite3Utf8Read(&local_58);
  bVar5 = true;
  if (uVar8 < uVar7) {
    bVar5 = bVar11;
  }
  if (uVar14 <= uVar7) {
    bVar11 = bVar5;
  }
  goto LAB_00150552;
}

Assistant:

static int patternCompare(
  const u8 *zPattern,              /* The glob pattern */
  const u8 *zString,               /* The string to compare against the glob */
  const struct compareInfo *pInfo, /* Information about how to do the compare */
  u32 esc                          /* The escape character */
){
  u32 c, c2;
  int invert;
  int seen;
  u8 matchOne = pInfo->matchOne;
  u8 matchAll = pInfo->matchAll;
  u8 matchSet = pInfo->matchSet;
  u8 noCase = pInfo->noCase; 
  int prevEscape = 0;     /* True if the previous character was 'escape' */

  while( (c = sqlite3Utf8Read(&zPattern))!=0 ){
    if( c==matchAll && !prevEscape ){
      while( (c=sqlite3Utf8Read(&zPattern)) == matchAll
               || c == matchOne ){
        if( c==matchOne && sqlite3Utf8Read(&zString)==0 ){
          return 0;
        }
      }
      if( c==0 ){
        return 1;
      }else if( c==esc ){
        c = sqlite3Utf8Read(&zPattern);
        if( c==0 ){
          return 0;
        }
      }else if( c==matchSet ){
        assert( esc==0 );         /* This is GLOB, not LIKE */
        assert( matchSet<0x80 );  /* '[' is a single-byte character */
        while( *zString && patternCompare(&zPattern[-1],zString,pInfo,esc)==0 ){
          SQLITE_SKIP_UTF8(zString);
        }
        return *zString!=0;
      }
      while( (c2 = sqlite3Utf8Read(&zString))!=0 ){
        if( noCase ){
          GlogUpperToLower(c2);
          GlogUpperToLower(c);
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
            GlogUpperToLower(c2);
          }
        }else{
          while( c2 != 0 && c2 != c ){
            c2 = sqlite3Utf8Read(&zString);
          }
        }
        if( c2==0 ) return 0;
        if( patternCompare(zPattern,zString,pInfo,esc) ) return 1;
      }
      return 0;
    }else if( c==matchOne && !prevEscape ){
      if( sqlite3Utf8Read(&zString)==0 ){
        return 0;
      }
    }else if( c==matchSet ){
      u32 prior_c = 0;
      assert( esc==0 );    /* This only occurs for GLOB, not LIKE */
      seen = 0;
      invert = 0;
      c = sqlite3Utf8Read(&zString);
      if( c==0 ) return 0;
      c2 = sqlite3Utf8Read(&zPattern);
      if( c2=='^' ){
        invert = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==']' ){
        if( c==']' ) seen = 1;
        c2 = sqlite3Utf8Read(&zPattern);
      }
      while( c2 && c2!=']' ){
        if( c2=='-' && zPattern[0]!=']' && zPattern[0]!=0 && prior_c>0 ){
          c2 = sqlite3Utf8Read(&zPattern);
          if( c>=prior_c && c<=c2 ) seen = 1;
          prior_c = 0;
        }else{
          if( c==c2 ){
            seen = 1;
          }
          prior_c = c2;
        }
        c2 = sqlite3Utf8Read(&zPattern);
      }
      if( c2==0 || (seen ^ invert)==0 ){
        return 0;
      }
    }else if( esc==c && !prevEscape ){
      prevEscape = 1;
    }else{
      c2 = sqlite3Utf8Read(&zString);
      if( noCase ){
        GlogUpperToLower(c);
        GlogUpperToLower(c2);
      }
      if( c!=c2 ){
        return 0;
      }
      prevEscape = 0;
    }
  }
  return *zString==0;
}